

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11::detail::make_object_base_type(PyTypeObject *metaclass)

{
  long lVar1;
  int iVar2;
  PyObject *pPVar3;
  error_already_set *this;
  object name_obj;
  object local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_58.super_handle.m_ptr = (handle)PyUnicode_FromString("pybind11_object");
  pPVar3 = (*metaclass->tp_alloc)(metaclass,0);
  if (pPVar3 == (PyObject *)0x0) {
    pybind11_fail("make_object_base_type(): error allocating type!");
  }
  if (local_58.super_handle.m_ptr == (PyObject *)0x0) {
    pPVar3[0x35].ob_refcnt = 0;
  }
  else {
    lVar1 = *(long *)local_58.super_handle.m_ptr;
    *(long *)local_58.super_handle.m_ptr = lVar1 + 1;
    pPVar3[0x35].ob_refcnt = (Py_ssize_t)local_58.super_handle.m_ptr;
    *(long *)local_58.super_handle.m_ptr = lVar1 + 2;
  }
  pPVar3[0x36].ob_refcnt = (Py_ssize_t)local_58.super_handle.m_ptr;
  pPVar3[1].ob_type = (PyTypeObject *)"pybind11_object";
  _PyBaseObject_Type = _PyBaseObject_Type + 1;
  pPVar3[0x10].ob_refcnt = (Py_ssize_t)&PyBaseObject_Type;
  pPVar3[2].ob_refcnt = 0x38;
  pPVar3[10].ob_type = (PyTypeObject *)0x600;
  pPVar3[0x13].ob_type = (PyTypeObject *)pybind11_object_new;
  pPVar3[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar3[3].ob_refcnt = (Py_ssize_t)pybind11_object_dealloc;
  pPVar3[0xd].ob_refcnt = 0x28;
  iVar2 = PyType_Ready(pPVar3);
  if (iVar2 < 0) {
    error_string_abi_cxx11_();
    std::operator+(&local_50,"PyType_Ready failed in make_object_base_type():",&local_30);
    pybind11_fail(&local_50);
  }
  str::str((str *)&local_50,"pybind11_builtins");
  iVar2 = PyObject_SetAttrString(pPVar3,"__module__",local_50._M_dataplus._M_p);
  if (iVar2 != 0) {
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  object::~object((object *)&local_50);
  if (((ulong)pPVar3[10].ob_type & 0x4000) == 0) {
    object::~object(&local_58);
    return pPVar3;
  }
  __assert_fail("!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/detail/class.h"
                ,0x191,"PyObject *pybind11::detail::make_object_base_type(PyTypeObject *)");
}

Assistant:

inline PyObject *make_object_base_type(PyTypeObject *metaclass) {
    constexpr auto *name = "pybind11_object";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail("make_object_base_type(): error allocating type!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyBaseObject_Type);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_new = pybind11_object_new;
    type->tp_init = pybind11_object_init;
    type->tp_dealloc = pybind11_object_dealloc;

    /* Support weak references (needed for the keep_alive feature) */
    type->tp_weaklistoffset = offsetof(instance, weakrefs);

    if (PyType_Ready(type) < 0)
        pybind11_fail("PyType_Ready failed in make_object_base_type():" + error_string());

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    assert(!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));
    return (PyObject *) heap_type;
}